

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void PDHG_PrintHugeCUPDHG(void)

{
  printf("\n");
  printf("  ____ _   _ ____  ____  _     ____\n");
  printf(" / ___| | | |  _ \\|  _ \\| |   |  _ \\\n");
  printf("| |   | | | | |_) | | | | |   | |_) |\n");
  printf("| |___| |_| |  __/| |_| | |___|  __/\n");
  printf(" \\____|\\___/|_|   |____/|_____|_|\n");
  printf("\n");
  return;
}

Assistant:

void PDHG_PrintHugeCUPDHG(void) {
  cupdlp_printf("\n");
  cupdlp_printf("  ____ _   _ ____  ____  _     ____\n");
  cupdlp_printf(" / ___| | | |  _ \\|  _ \\| |   |  _ \\\n");
  cupdlp_printf("| |   | | | | |_) | | | | |   | |_) |\n");
  cupdlp_printf("| |___| |_| |  __/| |_| | |___|  __/\n");
  cupdlp_printf(" \\____|\\___/|_|   |____/|_____|_|\n");
  cupdlp_printf("\n");
}